

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpc-test.c++
# Opt level: O3

Client * __thiscall
capnp::_::anon_unknown_0::TestContext::Vat::connect<capnproto_test::capnp::test::TestInterface>
          (Client *__return_storage_ptr__,Vat *this,StringPtr to,bool unique)

{
  Reader vatId;
  CapTableBuilder *pCVar1;
  Client *extraout_RAX;
  Client CVar2;
  Builder hostId;
  MallocMessageBuilder refMessage;
  Builder local_1b0;
  PointerBuilder local_198;
  StructBuilder local_178;
  undefined8 local_148;
  undefined8 uStack_140;
  undefined8 local_138;
  undefined8 uStack_130;
  undefined8 local_128;
  undefined8 uStack_120;
  MallocMessageBuilder local_118;
  
  MallocMessageBuilder::MallocMessageBuilder(&local_118,0x80,GROW_HEURISTICALLY);
  MessageBuilder::getRootInternal(&local_1b0,&local_118.super_MessageBuilder);
  local_198.pointer = local_1b0.builder.pointer;
  local_198.segment = local_1b0.builder.segment;
  local_198.capTable = local_1b0.builder.capTable;
  PointerBuilder::initStruct(&local_178,&local_198,(StructSize)0x10001);
  local_198.segment = local_178.segment;
  local_198.capTable = local_178.capTable;
  local_198.pointer = local_178.pointers;
  PointerBuilder::setBlob<capnp::Text>(&local_198,(Reader)to.content);
  *(byte *)local_178.data = *local_178.data & 0xfe;
  StructBuilder::asReader(&local_178);
  vatId._reader.capTable = (CapTableReader *)uStack_140;
  vatId._reader.segment = (SegmentReader *)local_148;
  vatId._reader.data = (void *)local_138;
  vatId._reader.pointers = (WirePointer *)uStack_130;
  vatId._reader.dataSize = (undefined4)local_128;
  vatId._reader.pointerCount = local_128._4_2_;
  vatId._reader._38_2_ = local_128._6_2_;
  vatId._reader._40_8_ = uStack_120;
  CVar2 = RpcSystemBase::baseBootstrap((RpcSystemBase *)&local_1b0,vatId);
  (*((local_1b0.builder.capTable)->super_CapTableReader)._vptr_CapTableReader[4])
            (&local_198,local_1b0.builder.capTable,CVar2.hook.ptr);
  pCVar1 = local_1b0.builder.capTable;
  *(undefined4 *)&__return_storage_ptr__->field_0x8 = local_198.segment._0_4_;
  *(undefined4 *)&__return_storage_ptr__->field_0xc = local_198.segment._4_4_;
  *(undefined4 *)&__return_storage_ptr__->field_0x10 = local_198.capTable._0_4_;
  *(undefined4 *)&__return_storage_ptr__->field_0x14 = local_198.capTable._4_4_;
  __return_storage_ptr__->_vptr_Client = (_func_int **)&Capability::Client::typeinfo;
  if (local_1b0.builder.capTable != (CapTableBuilder *)0x0) {
    local_1b0.builder.capTable = (CapTableBuilder *)0x0;
    (*(code *)(((local_1b0.builder.segment)->super_SegmentReader).arena)->_vptr_Arena)
              (local_1b0.builder.segment,
               (pCVar1->super_CapTableReader)._vptr_CapTableReader[-2] +
               (long)&(pCVar1->super_CapTableReader)._vptr_CapTableReader);
  }
  MallocMessageBuilder::~MallocMessageBuilder(&local_118);
  return extraout_RAX;
}

Assistant:

typename T::Client connect(kj::StringPtr to, bool unique = false) {
      MallocMessageBuilder refMessage(128);
      auto hostId = refMessage.initRoot<test::TestSturdyRefHostId>();
      hostId.setHost(to);
      hostId.setUnique(unique);
      return rpcSystem.bootstrap(hostId).castAs<T>();
    }